

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O3

_Bool M680X_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *inst_info)

{
  byte bVar1;
  inst_page1 iVar2;
  inst_pageX iVar3;
  m680x_op_type mVar4;
  m680x_insn mVar5;
  m680x_info *info;
  _Bool *p_Var6;
  m680x_info *pmVar7;
  ushort uVar8;
  uint16_t uVar9;
  MCInst *pMVar10;
  bool bVar11;
  _Bool _Var12;
  uint uVar13;
  ulong uVar14;
  ushort uVar15;
  e_cpu_type eVar16;
  uint uVar17;
  insn_props iVar18;
  uint uVar19;
  cpu_tables *pcVar20;
  uint uVar21;
  m680x_reg mVar22;
  e_access access;
  long lVar23;
  uint8_t *puVar24;
  undefined4 *puVar25;
  uint16_t uVar26;
  byte bVar27;
  bool bVar28;
  cs_detail *pcVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  cs_m680x_op *pcVar35;
  int i;
  ulong uVar36;
  byte bVar37;
  ushort local_7a;
  uint local_78;
  insn_desc local_74;
  MCInst *local_60;
  uint local_58;
  uint16_t local_52;
  uint8_t *local_50;
  uint16_t *local_48;
  size_t local_40;
  cs_detail *local_38;
  
  info = *(m680x_info **)(ud + 0x10);
  local_60 = MI;
  local_40 = code_len;
  MCInst_clear(MI);
  uVar19 = *(uint *)(ud + 4);
  eVar16 = M680X_CPU_TYPE_6800;
  local_48 = size;
  if (((((((uVar19 & 8) == 0) && (eVar16 = M680X_CPU_TYPE_6801, (uVar19 & 0x10) == 0)) &&
        (eVar16 = M680X_CPU_TYPE_6805, (uVar19 & 0x20) == 0)) &&
       ((eVar16 = M680X_CPU_TYPE_6808, (uVar19 & 0x40) == 0 &&
        (eVar16 = M680X_CPU_TYPE_HCS08, (uVar19 >> 10 & 1) == 0)))) &&
      (eVar16 = M680X_CPU_TYPE_6809, -1 < (char)uVar19)) &&
     (((eVar16 = M680X_CPU_TYPE_6301, (uVar19 & 2) == 0 &&
       (eVar16 = M680X_CPU_TYPE_6309, (uVar19 & 4) == 0)) &&
      ((eVar16 = M680X_CPU_TYPE_6811, (uVar19 >> 8 & 1) == 0 &&
       (eVar16 = M680X_CPU_TYPE_CPU12, (uVar19 >> 9 & 1) == 0)))))) {
    local_40 = 1;
  }
  else {
    info->code = code;
    local_58 = (uint)(ushort)local_40;
    info->size = (uint)(ushort)local_40;
    uVar26 = (uint16_t)address;
    info->offset = uVar26;
    info->cpu_type = eVar16;
    pcVar20 = g_cpu_tables + eVar16;
    info->cpu = pcVar20;
    pcVar29 = local_60->flat_insn->detail;
    uVar19 = (uint)address;
    local_52 = uVar26;
    if (pcVar29 != (cs_detail *)0x0) {
      memset(pcVar29,0,0x134);
      pcVar20 = info->cpu;
      uVar19 = (uint)info->offset;
      local_58 = info->size;
    }
    local_74.insn = M680X_INS_INVLD;
    local_74.hid[0] = illgl_hid;
    local_74.hid[1] = illgl_hid;
    local_74.insn_size = 0;
    local_74._18_2_ = 0;
    local_38 = pcVar29;
    memset(&info->m680x,0,0xdc);
    info->insn_size = '\x01';
    uVar19 = uVar19 & 0xffff;
    uVar17 = (int)(address & 0xffff) - uVar19;
    uVar34 = 0;
    uVar15 = local_7a;
    if (uVar17 < local_58) {
      uVar34 = (uint)address + 1;
      local_7a = (ushort)uVar34;
      local_50 = info->code;
      bVar37 = local_50[(int)uVar17];
      uVar36 = (ulong)bVar37;
      local_74.opcode = (uint32_t)bVar37;
      lVar23 = -3;
      do {
        local_78 = uVar19;
        if ((pcVar20->pageX_table_size[lVar23 + 3] == 0) || (pcVar20->pageX_table_size[lVar23] == 0)
           ) break;
        if (pcVar20->pageX_prefix[lVar23 + 3] == bVar37) {
          uVar17 = (uVar34 & 0xffff) - uVar19;
          uVar34 = (uint)bVar37;
          if (local_58 <= uVar17) goto LAB_0026ba56;
          bVar1 = local_50[(int)uVar17];
          uVar36 = (ulong)bVar1;
          uVar17 = (uint)bVar1;
          local_74.opcode = (uint32_t)CONCAT11(bVar37,bVar1);
          iVar30 = (int)pcVar20->pageX_table_size[lVar23 + 3];
          uVar34 = local_74.opcode;
          if (iVar30 < 1) goto LAB_0026ba56;
          local_7a = uVar26 + 2;
          iVar30 = iVar30 + -1;
          iVar32 = 0;
          iVar33 = iVar30;
          goto LAB_0026b0f9;
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != 0);
LAB_0026affc:
      uVar17 = (uint)uVar36;
      iVar2 = pcVar20->inst_page1_table[uVar36];
      uVar21 = (uint)iVar2 & 0x1ff;
      uVar14 = CONCAT44((uint)iVar2 >> 9,iVar2);
      local_74._12_8_ = CONCAT44(local_74._16_4_,(uint)iVar2 >> 0xf) & 0xffffffff0000003f;
LAB_0026b027:
      local_74._4_8_ = uVar14 & 0x3f000001ff;
      uVar34 = local_74.opcode;
      if (uVar21 == 0x9f) {
        lVar23 = 0;
        bVar11 = true;
        do {
          bVar28 = bVar11;
          if ((pcVar20->overlay_table_size[lVar23] == 0) ||
             (pcVar20->inst_overlay_table[lVar23] == (inst_pageX *)0x0)) break;
          iVar30 = (int)pcVar20->overlay_table_size[lVar23];
          if (0 < iVar30) {
            iVar30 = iVar30 + -1;
            iVar32 = 0;
            iVar33 = iVar30;
            do {
              iVar31 = iVar30 / 2;
              iVar3 = pcVar20->inst_overlay_table[lVar23][iVar31];
              if (((uint)iVar3 & 0xff) < uVar17) {
                iVar32 = iVar31 + 1;
              }
              else {
                if (((uint)iVar3 & 0xff) == uVar17) {
                  if (-2 < iVar30) {
                    local_74._12_8_ =
                         CONCAT44(local_74._16_4_,(uint)iVar3 >> 0x17) & 0xffffffff0000003f;
                    uVar21 = (uint)iVar3 >> 8 & 0x1ff;
                    local_74._4_8_ = CONCAT44((uint)iVar3 >> 0x11,(uint)iVar3 >> 8) & 0x3f000001ff;
                    goto LAB_0026b1a1;
                  }
                  break;
                }
                iVar33 = iVar31 + -1;
              }
              iVar30 = iVar33 + iVar32;
            } while (iVar32 <= iVar33);
          }
          lVar23 = 1;
          bVar11 = false;
        } while (bVar28);
        goto LAB_0026ba56;
      }
LAB_0026b1a1:
      local_74.insn_size = local_7a - uVar26;
      if ((uVar21 == 0) || (uVar21 == 0x9f)) goto LAB_0026ba56;
      lVar23 = 0;
      bVar11 = true;
      uVar17 = local_58;
      do {
        bVar28 = bVar11;
        uVar8 = local_7a;
        bVar37 = 1;
        uVar9 = local_74.insn_size;
        uVar34 = local_74.opcode;
        uVar15 = local_7a;
        switch(local_74.hid[lVar23]) {
        case illgl_hid:
        case inh_hid:
        case opidx_hid:
        case idxX0_hid:
        case idxX0p_hid:
          goto switchD_0026b1ef_caseD_0;
        case rel8_hid:
        case imm8_hid:
        case dir_hid:
        case idxX_hid:
        case idxY_hid:
        case rbits_hid:
        case idxS_hid:
        case idxXp_hid:
        case index_hid:
          goto switchD_0026b1ef_caseD_1;
        case rel16_hid:
        case imm16_hid:
        case ext_hid:
        case opidxdr_hid:
        case idxX16_hid:
        case imm8rel_hid:
        case idxS16_hid:
          goto switchD_0026b1ef_caseD_2;
        case imm32_hid:
          local_74.insn_size = local_74.insn_size + 4;
          bVar37 = (local_7a + 3 & 0xffff) - uVar19 < uVar17;
          local_7a = local_7a + 4;
          break;
        case idx09_hid:
          local_74.insn_size = local_74.insn_size + 1;
          uVar15 = local_7a + 1;
          if (uVar17 <= local_7a - uVar19) goto LAB_0026ba56;
          switch(local_50[(int)(local_7a - uVar19)] & 0x9f) {
          case 0x87:
          case 0x8a:
          case 0x8e:
          case 0x8f:
          case 0x90:
          case 0x92:
          case 0x97:
          case 0x9a:
          case 0x9e:
            bVar37 = 0;
            uVar19 = local_78;
            local_7a = uVar15;
            break;
          case 0x88:
          case 0x8c:
          case 0x98:
          case 0x9c:
            local_74.insn_size = uVar9 + 2;
            uVar19 = local_78;
            goto LAB_0026b4b9;
          case 0x89:
          case 0x8d:
          case 0x99:
          case 0x9d:
            bVar37 = (local_7a + 2 & 0xffff) - local_78 < uVar17;
            goto LAB_0026b533;
          default:
            bVar37 = 1;
            uVar19 = local_78;
            local_7a = uVar15;
            break;
          case 0x9f:
            bVar37 = (local_7a + 2 & 0xffff) - local_78 < uVar17 &&
                     (local_50[(int)(local_7a - uVar19)] & 0x60) == 0;
LAB_0026b533:
            local_74.insn_size = uVar9 + 3;
            uVar19 = local_78;
            local_7a = local_7a + 3;
          }
          break;
        case rr09_hid:
          local_74.insn_size = local_74.insn_size + 1;
          uVar15 = local_7a + 1;
          uVar13 = (uint)local_7a;
          if (uVar13 - uVar19 < uVar17) {
            p_Var6 = pcVar20->tfr_reg_valid;
            bVar37 = 1;
            local_7a = uVar15;
            if (p_Var6 == (_Bool *)0x0) goto switchD_0026b1ef_caseD_0;
            if (p_Var6[local_50[(int)(uVar13 - uVar19)] >> 4] == true) {
              bVar37 = p_Var6[local_50[(int)(uVar13 - uVar19)] & 0xf];
              break;
            }
          }
          goto LAB_0026ba56;
        case bitmv_hid:
          local_74.insn_size = local_74.insn_size + 2;
          if ((local_7a - uVar19 < uVar17) && (local_50[(int)(local_7a - uVar19)] < 0xc0))
          goto LAB_0026b4b9;
          goto LAB_0026ba56;
        case tfm_hid:
          local_74.insn_size = local_74.insn_size + 1;
          uVar15 = local_7a + 1;
          if ((uVar17 <= local_7a - uVar19) || (0x4f < local_50[(int)(local_7a - uVar19)]))
          goto LAB_0026ba56;
          bVar37 = (local_50[(int)(local_7a - uVar19)] & 0xf) < 5;
          local_7a = uVar15;
          break;
        case idx12_hid:
          _Var12 = false;
          goto LAB_0026b4c5;
        case idx12s_hid:
          _Var12 = true;
LAB_0026b4c5:
          local_74.insn_size = local_74.insn_size + 1;
          uVar13 = (uint)local_7a;
          uVar15 = local_7a + 1;
          if (uVar17 <= uVar13 - uVar19) goto LAB_0026ba56;
          local_7a = local_7a + 1;
          bVar37 = is_indexed12_post_byte_valid
                             (info,&local_7a,local_50[(int)(uVar13 - uVar19)],&local_74,_Var12);
          uVar19 = local_78;
          uVar17 = local_58;
          break;
        case rr12_hid:
          local_74.insn_size = local_74.insn_size + 1;
          uVar15 = local_7a + 1;
          if (uVar17 <= local_7a - uVar19) goto LAB_0026ba56;
          bVar37 = local_50[(int)(local_7a - uVar19)] >> 3 ^ 1;
          local_7a = local_7a + 1;
          break;
        case loop_hid:
          local_74.insn_size = local_74.insn_size + 2;
          if (((uVar17 <= local_7a - uVar19) || (0xbf < local_50[(int)(local_7a - uVar19)])) ||
             ((local_50[(int)(local_7a - uVar19)] & 6) == 2)) goto LAB_0026ba56;
LAB_0026b4b9:
          local_7a = local_7a + 2;
          bVar37 = (ushort)(uVar8 + 1) - uVar19 < uVar17;
          break;
        case imm8i12x_hid:
          local_74.insn_size = local_74.insn_size + 1;
          uVar13 = (uint)local_7a;
          uVar15 = local_7a + 1;
          if ((uVar17 <= uVar13 - uVar19) ||
             (local_7a = local_7a + 1,
             _Var12 = is_indexed12_post_byte_valid
                                (info,&local_7a,local_50[(int)(uVar13 - uVar19)],&local_74,false),
             uVar34 = local_74.opcode, uVar19 = local_78, uVar15 = local_7a, uVar17 = local_58,
             !_Var12)) goto LAB_0026ba56;
switchD_0026b1ef_caseD_1:
          local_74.insn_size = local_74.insn_size + 1;
          bVar37 = local_7a - uVar19 < uVar17;
          local_7a = local_7a + 1;
          break;
        case imm16i12x_hid:
        case exti12x_hid:
          local_74.insn_size = local_74.insn_size + 1;
          uVar13 = (uint)local_7a;
          uVar15 = local_7a + 1;
          if ((uVar17 <= uVar13 - uVar19) ||
             (local_7a = local_7a + 1,
             _Var12 = is_indexed12_post_byte_valid
                                (info,&local_7a,local_50[(int)(uVar13 - uVar19)],&local_74,false),
             uVar34 = local_74.opcode, uVar19 = local_78, uVar15 = local_7a, uVar17 = local_58,
             !_Var12)) goto LAB_0026ba56;
switchD_0026b1ef_caseD_2:
          local_74.insn_size = local_74.insn_size + 2;
          bVar37 = (local_7a + 1 & 0xffff) - uVar19 < uVar17;
          local_7a = local_7a + 2;
          break;
        default:
          fprintf(_stderr,"Internal error: Unexpected instruction handler id %d\n");
          uVar34 = local_74.opcode;
          uVar15 = local_7a;
          goto LAB_0026ba56;
        }
        uVar34 = local_74.opcode;
        uVar15 = local_7a;
        if ((bVar37 & 1) == 0) goto LAB_0026ba56;
switchD_0026b1ef_caseD_0:
        lVar23 = 1;
        bVar11 = false;
      } while (bVar28);
      uVar34 = local_74.opcode;
      uVar15 = local_7a;
      if ((bVar37 & 1) == 0) goto LAB_0026ba56;
      local_52 = (uVar26 - (local_74.opcode < 0x100)) + 2;
      info->insn = local_74.insn;
      MCInst_setOpcode(local_60,local_74.opcode);
      pMVar10 = local_60;
      iVar18 = g_insn_props[info->insn];
      mVar22 = (uint)iVar18 >> 9 & (M680X_REG_U|M680X_REG_S);
      if (mVar22 != M680X_REG_INVALID) {
        if (mVar22 == M680X_REG_HX) {
          mVar22 = (uint)(info->cpu->reg_byte_size[0xb] == '\0') * 2 + M680X_REG_HX;
        }
        bVar37 = (info->m680x).op_count;
        bVar27 = bVar37 + 1;
        (info->m680x).op_count = bVar27;
        (info->m680x).operands[bVar37].type = M680X_OP_REGISTER;
        (info->m680x).operands[bVar37].field_1.reg = mVar22;
        puVar24 = info->cpu->reg_byte_size;
        (info->m680x).operands[bVar37].size = puVar24[mVar22];
        bVar1 = (info->m680x).flags;
        (info->m680x).flags = bVar1 | 1;
        mVar22 = (uint)iVar18 >> 0xe & (M680X_REG_U|M680X_REG_S);
        if (mVar22 != M680X_REG_INVALID) {
          if (mVar22 == M680X_REG_HX) {
            mVar22 = (uint)(puVar24[0xb] == '\0') * 2 + M680X_REG_HX;
          }
          (info->m680x).op_count = bVar37 + 2;
          (info->m680x).operands[bVar27].type = M680X_OP_REGISTER;
          (info->m680x).operands[bVar27].field_1.reg = mVar22;
          (info->m680x).operands[bVar27].size = info->cpu->reg_byte_size[mVar22];
          (info->m680x).flags = bVar1 | 3;
        }
      }
      (*g_insn_handler[(ulong)local_74._4_8_ >> 0x20])(local_60,info,&local_52);
      (*g_insn_handler[local_74._12_8_ & 0xffffffff])(pMVar10,info,&local_52);
      uVar36 = (ulong)info->insn;
      iVar18 = g_insn_props[uVar36];
      if ((local_38 != (cs_detail *)0x0) && (((uint)iVar18 & 7) != 0)) {
        bVar37 = local_38->groups_count;
        local_38->groups_count = bVar37 + 1;
        local_38->groups[bVar37] = iVar18._0_1_ & 0xf;
        uVar36 = (ulong)info->insn;
        iVar18 = g_insn_props[uVar36];
      }
      pcVar20 = info->cpu;
      if (((((uint)iVar18 >> 0x13 & 1) != 0) &&
          (pcVar20->insn_cc_not_modified[0] != (m680x_insn)uVar36)) &&
         (pcVar20->insn_cc_not_modified[1] != (m680x_insn)uVar36)) {
        add_reg_to_rw_list((MCInst *)local_60->flat_insn->detail,M680X_REG_CC,MODIFY);
        uVar36 = (ulong)info->insn;
        pcVar20 = info->cpu;
      }
      if ((pcVar20->insn_cc_not_modified[0] == (m680x_insn)uVar36) ||
         (pcVar20->insn_cc_not_modified[1] == (m680x_insn)uVar36)) {
        uVar19 = 5;
      }
      else {
        uVar19 = (uint)g_insn_props[uVar36] >> 4 & 0x1f;
      }
      if (local_60->flat_insn->detail != (cs_detail *)0x0) {
        if ((info->m680x).op_count != '\0') {
          uVar36 = 0;
          pmVar7 = info;
          do {
            pcVar35 = (pmVar7->m680x).operands;
            uVar14 = 3;
            if ((uint)uVar36 < 3) {
              uVar14 = uVar36 & 0xffffffff;
            }
            pcVar29 = local_60->flat_insn->detail;
            if (pcVar29 != (cs_detail *)0x0) {
              mVar4 = pcVar35->type;
              if (mVar4 == M680X_OP_INDEXED) {
                add_reg_to_rw_list((MCInst *)pcVar29,(pmVar7->m680x).operands[0].field_1.reg,READ);
                if (((pmVar7->m680x).operands[0].field_1.imm == 0xd) &&
                   (info->cpu->reg_byte_size[0xc] != '\0')) {
                  add_reg_to_rw_list((MCInst *)local_60->flat_insn->detail,M680X_REG_H,READ);
                }
                mVar22 = (pmVar7->m680x).operands[0].field_1.idx.offset_reg;
                if (mVar22 != M680X_REG_INVALID) {
                  add_reg_to_rw_list((MCInst *)local_60->flat_insn->detail,mVar22,READ);
                }
                if ((((pmVar7->m680x).operands[0].field_1.idx.inc_dec != '\0') &&
                    (add_reg_to_rw_list((MCInst *)local_60->flat_insn->detail,
                                        (pmVar7->m680x).operands[0].field_1.reg,WRITE),
                    (pmVar7->m680x).operands[0].field_1.imm == 0xd)) &&
                   (info->cpu->reg_byte_size[0xc] != '\0')) {
                  pcVar29 = local_60->flat_insn->detail;
                  mVar22 = M680X_REG_H;
                  access = WRITE;
                  goto LAB_0026b7de;
                }
              }
              else if (mVar4 == M680X_OP_REGISTER) {
                access = g_access_mode_to_access[uVar14][uVar19];
                mVar22 = (pmVar7->m680x).operands[0].field_1.reg;
LAB_0026b7de:
                add_reg_to_rw_list((MCInst *)pcVar29,mVar22,access);
              }
            }
            uVar36 = uVar36 + 1;
            bVar37 = (info->m680x).op_count;
            pmVar7 = (m680x_info *)pcVar35;
          } while (uVar36 < bVar37);
          if (local_60->flat_insn->detail == (cs_detail *)0x0) goto LAB_0026ba12;
          mVar5 = info->insn;
          uVar36 = (ulong)mVar5;
          if ((uVar19 != 0) && (bVar37 != 0)) {
            puVar24 = &(info->m680x).operands[0].access;
            uVar14 = 0;
            iVar30 = 0;
            do {
              iVar33 = iVar30;
              if (uVar14 == 1) {
                iVar33 = 1;
              }
              if (mVar5 != M680X_INS_MULD) {
                iVar33 = iVar30;
              }
              iVar30 = iVar33;
              iVar33 = (int)uVar14 + iVar30;
              if (2 < iVar33) {
                iVar33 = 3;
              }
              *puVar24 = (char)g_access_mode_to_access[iVar33][uVar19];
              uVar14 = uVar14 + 1;
              puVar24 = puVar24 + 0x18;
            } while (bVar37 != uVar14);
          }
        }
        if ((g_insn_props[uVar36].field_0x2 & 0x10) != 0) {
          puVar25 = &DAT_0058f98c;
          lVar23 = 0;
          do {
            if ((info->insn == (&set_changed_regs_read_write_counts_changed_regs)[lVar23 * 0xc]) &&
               (mVar22 = (&DAT_0058f988)[lVar23 * 0xc], mVar22 != M680X_REG_INVALID)) {
              uVar19 = (&DAT_0058f984)[lVar23 * 0xc];
              uVar36 = 0;
              do {
                if ((info->cpu->reg_byte_size[mVar22] != '\0') ||
                   (mVar22 = M680X_REG_X, info->insn == M680X_INS_MUL)) {
                  uVar14 = 3;
                  if ((int)uVar36 < 3) {
                    uVar14 = uVar36 & 0xffffffff;
                  }
                  add_reg_to_rw_list((MCInst *)local_60->flat_insn->detail,mVar22,
                                     g_access_mode_to_access[uVar14][uVar19]);
                }
                mVar22 = puVar25[uVar36];
                uVar36 = uVar36 + 1;
              } while (mVar22 != M680X_REG_INVALID);
            }
            lVar23 = lVar23 + 1;
            puVar25 = puVar25 + 0xc;
          } while (lVar23 != 0x33);
        }
      }
LAB_0026ba12:
      info->insn_size = (uint8_t)local_74.insn_size;
      uVar19 = local_74.insn_size & 0xff;
      if ((local_74._12_8_ & 0xff00000000) == 0) {
        _Var12 = false;
        uVar26 = 1;
        goto LAB_0026bac7;
      }
    }
    else {
LAB_0026ba56:
      local_7a = uVar15;
      MCInst_setOpcode(local_60,uVar34);
      bVar37 = (info->m680x).op_count;
      (info->m680x).op_count = bVar37 + 1;
      info->insn = M680X_INS_ILLGL;
      lVar23 = (address & 0xffff) - (ulong)info->offset;
      uVar19 = 0;
      if ((uint)lVar23 < info->size) {
        uVar19 = (uint)info->code[lVar23];
      }
      (info->m680x).operands[bVar37].field_1.imm = uVar19;
      (info->m680x).operands[bVar37].type = M680X_OP_IMMEDIATE;
      (info->m680x).operands[bVar37].size = '\x01';
      uVar19 = 1;
    }
    if (uVar19 <= local_40) {
      _Var12 = true;
      uVar26 = (uint16_t)uVar19;
      goto LAB_0026bac7;
    }
  }
  uVar26 = (uint16_t)local_40;
  _Var12 = false;
LAB_0026bac7:
  *local_48 = uVar26;
  return _Var12;
LAB_0026b0f9:
  do {
    iVar31 = iVar30 / 2;
    uVar13 = *(uint *)(pcVar20->pageX_table_size[lVar23] + (long)iVar31 * 4);
    if ((uVar13 & 0xff) < (uint)bVar1) {
      iVar32 = iVar31 + 1;
    }
    else {
      if ((uVar13 & 0xff) == (uint)bVar1) {
        if (-2 < iVar30) {
          local_74._12_8_ = CONCAT44(local_74._16_4_,uVar13 >> 0x17) & 0xffffffff0000003f;
          uVar21 = uVar13 >> 8 & 0x1ff;
          uVar14 = CONCAT44(uVar13 >> 0x11,uVar13 >> 8);
          if (uVar21 == 0x9f) goto LAB_0026affc;
          goto LAB_0026b027;
        }
        break;
      }
      iVar33 = iVar31 + -1;
    }
    iVar30 = iVar33 + iVar32;
  } while (iVar32 <= iVar33);
  goto LAB_0026ba56;
}

Assistant:

bool M680X_getInstruction(csh ud, const uint8_t *code, size_t code_len,
	MCInst *MI, uint16_t *size, uint64_t address, void *inst_info)
{
	unsigned int insn_size = 0;
	e_cpu_type cpu_type = M680X_CPU_TYPE_INVALID; // No default CPU type
	cs_struct *handle = (cs_struct *)ud;
	m680x_info *info = (m680x_info *)handle->printer_info;

	MCInst_clear(MI);

	if (handle->mode & CS_MODE_M680X_6800)
		cpu_type = M680X_CPU_TYPE_6800;

	else if (handle->mode & CS_MODE_M680X_6801)
		cpu_type = M680X_CPU_TYPE_6801;

	else if (handle->mode & CS_MODE_M680X_6805)
		cpu_type = M680X_CPU_TYPE_6805;

	else if (handle->mode & CS_MODE_M680X_6808)
		cpu_type = M680X_CPU_TYPE_6808;

	else if (handle->mode & CS_MODE_M680X_HCS08)
		cpu_type = M680X_CPU_TYPE_HCS08;

	else if (handle->mode & CS_MODE_M680X_6809)
		cpu_type = M680X_CPU_TYPE_6809;

	else if (handle->mode & CS_MODE_M680X_6301)
		cpu_type = M680X_CPU_TYPE_6301;

	else if (handle->mode & CS_MODE_M680X_6309)
		cpu_type = M680X_CPU_TYPE_6309;

	else if (handle->mode & CS_MODE_M680X_6811)
		cpu_type = M680X_CPU_TYPE_6811;

	else if (handle->mode & CS_MODE_M680X_CPU12)
		cpu_type = M680X_CPU_TYPE_CPU12;

	if (cpu_type != M680X_CPU_TYPE_INVALID &&
		m680x_setup_internals(info, cpu_type, (uint16_t)address, code,
			code_len))
		insn_size = m680x_disassemble(MI, info, (uint16_t)address);

	if (insn_size == 0) {
		*size = 1;
		return false;
	}

	// Make sure we always stay within range
	if (insn_size > code_len) {
		*size = (uint16_t)code_len;
		return false;
	}
	else
		*size = (uint16_t)insn_size;

	return true;
}